

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_compressionParameters *
ZSTD_adjustCParams(ZSTD_compressionParameters *__return_storage_ptr__,
                  ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ZSTD_compressionParameters cPar_00;
  ZSTD_strategy ZVar4;
  ZSTD_strategy ZVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  ZVar5 = ZSTD_btultra2;
  if (cPar.strategy < ZSTD_btultra2) {
    ZVar5 = cPar.strategy;
  }
  ZVar4 = ZSTD_fast;
  if (0 < (int)cPar.strategy) {
    ZVar4 = ZVar5;
  }
  auVar6 = vpmovsxbd_avx(ZEXT416(0x106060a));
  auVar3 = vpminud_avx(cPar._0_16_,_DAT_001b5ae0);
  auVar2 = vpcmpgtd_avx(auVar6,cPar._0_16_);
  auVar2 = vblendvps_avx(auVar3,auVar6,auVar2);
  auVar7._8_8_ = 3;
  auVar7._0_8_ = 3;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = cPar._16_8_;
  auVar3 = vpcmpgtd_avx(auVar7,auVar6);
  auVar6 = vpminud_avx(auVar6,_DAT_001b5af0);
  auVar3 = vblendvps_avx(auVar6,auVar7,auVar3);
  uVar1 = vmovlps_avx(auVar3);
  cPar.minMatch = (uint)uVar1;
  cPar.targetLength = (uint)((ulong)uVar1 >> 0x20);
  cPar_00.strategy = ZVar4;
  cPar_00.targetLength = cPar.targetLength;
  cPar_00.minMatch = cPar.minMatch;
  cPar_00.windowLog = auVar2._0_4_;
  cPar_00.chainLog = auVar2._4_4_;
  cPar_00.hashLog = auVar2._8_4_;
  cPar_00.searchLog = auVar2._12_4_;
  ZSTD_adjustCParams_internal
            (__return_storage_ptr__,cPar_00,srcSize | -(ulong)(srcSize == 0),dictSize);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters
ZSTD_adjustCParams(ZSTD_compressionParameters cPar,
                   unsigned long long srcSize,
                   size_t dictSize)
{
    cPar = ZSTD_clampCParams(cPar);   /* resulting cPar is necessarily valid (all parameters within range) */
    if (srcSize == 0) srcSize = ZSTD_CONTENTSIZE_UNKNOWN;
    return ZSTD_adjustCParams_internal(cPar, srcSize, dictSize);
}